

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectangle.h
# Opt level: O2

rectangle * dlib::translate_rect(rectangle *rect,long x,long y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  rectangle *in_RDI;
  
  lVar1 = rect->l;
  lVar2 = rect->t;
  lVar3 = rect->b;
  in_RDI->r = x + rect->r;
  in_RDI->b = y + lVar3;
  in_RDI->l = lVar1 + x;
  in_RDI->t = lVar2 + y;
  return in_RDI;
}

Assistant:

inline const rectangle translate_rect (
        const rectangle& rect,
        long x,
        long y
    )
    {
        rectangle result;
        result.set_top ( rect.top() + y );
        result.set_bottom ( rect.bottom() + y );
        result.set_left ( rect.left() + x );
        result.set_right ( rect.right() + x );
        return result;
    }